

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.cpp
# Opt level: O1

VariableType * rsg::VariableType::getScalarType(Type baseType)

{
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  runtime_error *this;
  VariableType *pVVar1;
  undefined1 *puVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  switch(baseType) {
  case TYPE_FLOAT:
    pVVar1 = getScalarType::s_floatTypes;
    if (getScalarType(rsg::VariableType::Type)::s_floatTypes != '\0') {
      return pVVar1;
    }
    getScalarType();
    if ((extraout_RAX & 1) != 0) {
      return pVVar1;
    }
    puVar2 = &getScalarType(rsg::VariableType::Type)::s_floatTypes;
    break;
  case TYPE_INT:
    pVVar1 = getScalarType::s_intTypes;
    if (getScalarType(rsg::VariableType::Type)::s_intTypes != '\0') {
      return pVVar1;
    }
    getScalarType();
    if ((extraout_RAX_03 & 1) != 0) {
      return pVVar1;
    }
    puVar2 = &getScalarType(rsg::VariableType::Type)::s_intTypes;
    break;
  case TYPE_BOOL:
    pVVar1 = getScalarType::s_boolTypes;
    if (getScalarType(rsg::VariableType::Type)::s_boolTypes != '\0') {
      return pVVar1;
    }
    getScalarType();
    if ((extraout_RAX_01 & 1) != 0) {
      return pVVar1;
    }
    puVar2 = &getScalarType(rsg::VariableType::Type)::s_boolTypes;
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"VariableType::getScalarType(): unsupported type","");
    std::runtime_error::runtime_error(this,(string *)local_40);
    *(undefined ***)this = &PTR__runtime_error_021d12b8;
    __cxa_throw(this,&Exception::typeinfo,std::runtime_error::~runtime_error);
  case TYPE_SAMPLER_2D:
    pVVar1 = &getScalarType::sampler2DType;
    if (getScalarType(rsg::VariableType::Type)::sampler2DType != '\0') {
      return pVVar1;
    }
    getScalarType();
    if ((extraout_RAX_02 & 1) != 0) {
      return pVVar1;
    }
    puVar2 = &getScalarType(rsg::VariableType::Type)::sampler2DType;
    break;
  case TYPE_SAMPLER_CUBE:
    pVVar1 = &getScalarType::samplerCubeType;
    if (getScalarType(rsg::VariableType::Type)::samplerCubeType != '\0') {
      return pVVar1;
    }
    getScalarType();
    if ((extraout_RAX_00 & 1) != 0) {
      return pVVar1;
    }
    puVar2 = &getScalarType(rsg::VariableType::Type)::samplerCubeType;
  }
  __cxa_guard_release(puVar2);
  return pVVar1;
}

Assistant:

const VariableType& VariableType::getScalarType (Type baseType)
{
	switch (baseType)
	{
		case TYPE_FLOAT:
		{
			static const VariableType s_floatTypes[] =
			{
				VariableType(TYPE_FLOAT, 1)
				// \todo [pyry] Extend with different precision variants?
			};
			return s_floatTypes[0];
		}

		case TYPE_INT:
		{
			static const VariableType s_intTypes[] =
			{
				VariableType(TYPE_INT, 1)
			};
			return s_intTypes[0];
		}

		case TYPE_BOOL:
		{
			static const VariableType s_boolTypes[] =
			{
				VariableType(TYPE_BOOL, 1)
			};
			return s_boolTypes[0];
		}

		case TYPE_SAMPLER_2D:
		{
			static const VariableType sampler2DType = VariableType(TYPE_SAMPLER_2D, 1);
			return sampler2DType;
		}

		case TYPE_SAMPLER_CUBE:
		{
			static const VariableType samplerCubeType = VariableType(TYPE_SAMPLER_CUBE, 1);
			return samplerCubeType;
		}

		default:
			DE_ASSERT(DE_FALSE);
			throw Exception("VariableType::getScalarType(): unsupported type");
	}
}